

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc.c
# Opt level: O0

void sysbvm_gc_safepoint(sysbvm_context_t *context)

{
  long *in_FS_OFFSET;
  sysbvm_context_t *context_local;
  
  if (((*(int *)(*in_FS_OFFSET + -0x20) == 0) &&
      (((context->heap).shouldAttemptToCollect & 1U) != 0)) && ((context->gcDisabled & 1U) == 0)) {
    sysbvm_gc_debugStackValidationHook();
    sysbvm_gc_performCycle(context);
  }
  return;
}

Assistant:

SYSBVM_API void sysbvm_gc_safepoint(sysbvm_context_t *context)
{
    if(sysbvm_gc_perThreadLockCount != 0)
        return;

    // Check the attempt collection flag on the heap.
    if(!context->heap.shouldAttemptToCollect || context->gcDisabled)
        return;

    // TODO: Add Support for multiple threads.

    // Hook location for validating GC stack roots via GDB scripting.
    sysbvm_gc_debugStackValidationHook();
    sysbvm_gc_performCycle(context);
}